

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

result_type __thiscall
math::wide_integer::uniform_int_distribution<1024u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<1024u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  unsigned_fast_type i;
  byte bVar4;
  sbyte sVar5;
  value_type_conflict *in_RCX;
  long lVar6;
  ulong uVar7;
  uint uVar11;
  value_type_conflict *pvVar8;
  undefined4 *puVar9;
  uintwide_t<1024U,_unsigned_int,_void,_false> *puVar10;
  value_type_conflict *pvVar12;
  undefined4 *puVar13;
  uniform_int_distribution<1024u,unsigned_int,void,false> *puVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  byte bVar18;
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> result_max;
  undefined1 local_218 [32];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  int local_198 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  value_type_conflict local_98 [32];
  
  bVar18 = 0;
  *(undefined1 (*) [16])(this + 0x70) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x60) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x50) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x40) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x20) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  uVar11._0_3_ = input_params->param_a;
  uVar11._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  uVar15 = 0;
  bVar3 = 1;
  lVar6 = 0;
  do {
    bVar4 = bVar3 - 1 & 3;
    if (bVar4 == 0) {
      uVar16 = (uVar11 % 0xadc8) * 0xbc8f;
      uVar15 = (uVar11 / 0xadc8) * 0xd47;
      uVar11 = (uVar11 / 0xadc8) * -0xd47;
      if (uVar16 < uVar15) {
        uVar11 = uVar15 ^ 0x7fffffff;
      }
      uVar11 = uVar11 + uVar16;
      *(uint *)input_params = uVar11;
      uVar15 = uVar11;
    }
    sVar5 = bVar4 << 3;
    *(uint *)(this + lVar6) = *(uint *)(this + lVar6) | (uVar15 >> sVar5 & 0xff) << sVar5;
    lVar6 = lVar6 + (ulong)((bVar3 & 3) == 0) * 4;
    bVar3 = bVar3 + 1;
  } while (lVar6 != 0x80);
  pvVar8 = in_RCX;
  pvVar12 = (value_type_conflict *)local_118;
  for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pvVar12 = *pvVar8;
    pvVar8 = pvVar8 + 1;
    pvVar12 = pvVar12 + 1;
  }
  local_1a8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_218._16_16_ = (undefined1  [16])0x0;
  local_218._0_16_ = (undefined1  [16])0x0;
  lVar6 = 0x7c;
  while (lVar6 != -4) {
    piVar2 = (int *)(local_118 + lVar6);
    piVar1 = (int *)(local_218 + lVar6);
    lVar6 = lVar6 + -4;
    if (*piVar2 != *piVar1) goto LAB_0015239b;
  }
  pvVar8 = in_RCX + 0x20;
  pvVar12 = local_98;
  for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pvVar12 = *pvVar8;
    pvVar8 = pvVar8 + 1;
    pvVar12 = pvVar12 + 1;
  }
  local_198[0x1c] = 0xffffffff;
  local_198[0x1d] = 0xffffffff;
  local_198[0x1e] = 0xffffffff;
  local_198[0x1f] = 0xffffffff;
  local_198[0x18] = 0xffffffff;
  local_198[0x19] = 0xffffffff;
  local_198[0x1a] = 0xffffffff;
  local_198[0x1b] = 0xffffffff;
  local_198[0x14] = 0xffffffff;
  local_198[0x15] = 0xffffffff;
  local_198[0x16] = 0xffffffff;
  local_198[0x17] = 0xffffffff;
  local_198[0x10] = 0xffffffff;
  local_198[0x11] = 0xffffffff;
  local_198[0x12] = 0xffffffff;
  local_198[0x13] = 0xffffffff;
  local_198[0xc] = 0xffffffff;
  local_198[0xd] = 0xffffffff;
  local_198[0xe] = 0xffffffff;
  local_198[0xf] = 0xffffffff;
  local_198[8] = 0xffffffff;
  local_198[9] = 0xffffffff;
  local_198[10] = 0xffffffff;
  local_198[0xb] = 0xffffffff;
  local_198[4] = 0xffffffff;
  local_198[5] = 0xffffffff;
  local_198[6] = 0xffffffff;
  local_198[7] = 0xffffffff;
  local_198[0] = -1;
  local_198[1] = 0xffffffff;
  local_198[2] = 0xffffffff;
  local_198[3] = 0xffffffff;
  lVar6 = 0x7c;
  do {
    if (lVar6 == -4) goto LAB_001524c5;
    piVar1 = (int *)((long)local_98 + lVar6);
    piVar2 = (int *)((long)local_198 + lVar6);
    lVar6 = lVar6 + -4;
  } while (*piVar1 == *piVar2);
LAB_0015239b:
  pvVar8 = in_RCX + 0x20;
  pvVar12 = (value_type_conflict *)local_118;
  for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pvVar12 = *pvVar8;
    pvVar8 = pvVar8 + 1;
    pvVar12 = pvVar12 + 1;
  }
  pvVar8 = in_RCX;
  pvVar12 = local_98;
  for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pvVar12 = *pvVar8;
    pvVar8 = pvVar8 + 1;
    pvVar12 = pvVar12 + 1;
  }
  lVar6 = 0;
  bVar17 = false;
  do {
    uVar7 = ((ulong)*(uint *)(local_118 + lVar6 * 4) - (ulong)bVar17) - (ulong)local_98[lVar6];
    *(int *)(local_118 + lVar6 * 4) = (int)uVar7;
    bVar17 = uVar7 >> 0x20 != 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  puVar9 = (undefined4 *)local_118;
  puVar13 = (undefined4 *)local_218;
  for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar13 = *puVar9;
    puVar9 = puVar9 + 1;
    puVar13 = puVar13 + 1;
  }
  lVar6 = 0;
  do {
    piVar1 = (int *)(local_218 + lVar6);
    *piVar1 = *piVar1 + 1;
    if (*piVar1 != 0) break;
    bVar17 = lVar6 != 0x7c;
    lVar6 = lVar6 + 4;
  } while (bVar17);
  if ((uniform_int_distribution<1024u,unsigned_int,void,false> *)local_218 == this) {
    *(undefined1 (*) [16])(this + 0x70) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + 0x60) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + 0x50) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + 0x40) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + 0x30) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + 0x20) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + 0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  }
  else {
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    local_f8 = (undefined1  [16])0x0;
    local_108 = (undefined1  [16])0x0;
    local_118 = (undefined1  [16])0x0;
    uintwide_t<1024U,_unsigned_int,_void,_false>::eval_divide_knuth
              ((uintwide_t<1024U,_unsigned_int,_void,_false> *)this,
               (uintwide_t<1024U,_unsigned_int,_void,_false> *)local_218,
               (uintwide_t<1024U,_unsigned_int,_void,_false> *)local_118);
    puVar10 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)local_118;
    puVar14 = this;
    for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(value_type_conflict *)puVar14 = (puVar10->values).super_array<unsigned_int,_32UL>.elems[0];
      puVar10 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
                ((long)puVar10 + ((ulong)bVar18 * -2 + 1) * 4);
      puVar14 = puVar14 + (ulong)bVar18 * -8 + 4;
    }
  }
  puVar10 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)local_118;
  for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
    (puVar10->values).super_array<unsigned_int,_32UL>.elems[0] = *in_RCX;
    in_RCX = in_RCX + (ulong)bVar18 * -2 + 1;
    puVar10 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
              ((long)puVar10 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  uintwide_t<1024U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<1024U,_unsigned_int,_void,_false> *)this,
             (uintwide_t<1024U,_unsigned_int,_void,_false> *)local_118);
LAB_001524c5:
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }